

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

string * tinyusdz::value::print_array_snipped<unsigned_long>
                   (string *__return_storage_ptr__,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *vals,size_t N)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((N == 0) ||
     (uVar1 = (long)(vals->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(vals->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3, uVar1 <= N * 2)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    if ((vals->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (vals->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar1 = 0;
      do {
        if (uVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)(vals->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vals->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    uVar3 = N;
    if (uVar1 < N) {
      uVar3 = uVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    if (uVar3 < uVar1 - N) {
      uVar3 = uVar1 - N;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
    uVar1 = uVar3;
    if (uVar3 < (ulong)((long)(vals->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(vals->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
      do {
        if (uVar3 < uVar1) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)(vals->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vals->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const std::vector<T> &vals, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= vals.size())) {
    os << "[";
    for (size_t i = 0; i < vals.size(); i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, vals.size());
    size_t tail_start = (std::max)(vals.size() - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < vals.size(); i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}